

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info.cpp
# Opt level: O3

void test(void)

{
  ostream *poVar1;
  long *plVar2;
  tuple<int,_int,_int> info;
  int local_24;
  int local_20;
  int local_1c;
  
  get_running_sleeping_total_threads();
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  plVar2 = (long *)std::ostream::operator<<(poVar1,local_24);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void test() {
    auto info = get_running_sleeping_total_threads();
    std::cout << std::get<0>(info) << "," << std::get<1>(info)
        << "," << std::get<2>(info) << std::endl;
}